

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZSkylineNSymStructMatrix.cpp
# Opt level: O1

void __thiscall
TPZSkylineNSymStructMatrix<double,_TPZStructMatrixTBBFlow<double>_>::TPZSkylineNSymStructMatrix
          (TPZSkylineNSymStructMatrix<double,_TPZStructMatrixTBBFlow<double>_> *this,
          TPZAutoPointer<TPZCompMesh> *cmesh)

{
  TPZAutoPointer<TPZCompMesh> local_20;
  
  *(undefined8 *)
   &(this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixTBBFlow<double>_>).field_0xf0 =
       0x19df7f8;
  *(undefined8 *)
   &(this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixTBBFlow<double>_>).
    super_TPZStructMatrixT<double>.super_TPZStructMatrix = 0x19df8c0;
  *(undefined4 *)
   &(this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixTBBFlow<double>_>).field_0xf8 = 0;
  (this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixTBBFlow<double>_>).field_0xfc = 1;
  local_20 = (TPZAutoPointer<TPZCompMesh>)cmesh->fRef;
  LOCK();
  ((local_20.fRef)->fCounter).super___atomic_base<int>._M_i =
       ((local_20.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
  UNLOCK();
  TPZStructMatrix::TPZStructMatrix
            ((TPZStructMatrix *)this,&PTR_construction_vtable_104__019ddc98,&local_20);
  *(undefined8 *)
   &(this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixTBBFlow<double>_>).
    super_TPZStructMatrixT<double>.super_TPZStructMatrix = 0x19df1f8;
  *(undefined8 *)
   &(this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixTBBFlow<double>_>).field_0xf0 =
       0x19df2d8;
  TPZStructMatrixTBBFlow<double>::TPZStructMatrixTBBFlow
            ((TPZStructMatrixTBBFlow<double> *)
             &(this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixTBBFlow<double>_>).
              super_TPZStructMatrixT<double>.super_TPZStructMatrix.field_0xa0,
             &PTR_construction_vtable_104__019ddcc0);
  *(undefined8 *)
   &(this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixTBBFlow<double>_>).
    super_TPZStructMatrixT<double>.super_TPZStructMatrix = 0x19def28;
  *(undefined8 *)
   &(this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixTBBFlow<double>_>).field_0xf0 =
       0x19df0e8;
  *(undefined8 *)
   &(this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixTBBFlow<double>_>).
    super_TPZStructMatrixT<double>.super_TPZStructMatrix.field_0xa0 = 0x19deff0;
  (this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixTBBFlow<double>_>).fActiveEquations.
  _vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5f0;
  (this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixTBBFlow<double>_>).fActiveEquations.
  fStore = (long *)0x0;
  (this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixTBBFlow<double>_>).fActiveEquations.
  fNElements = 0;
  (this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixTBBFlow<double>_>).fActiveEquations.
  fNAlloc = 0;
  (this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixTBBFlow<double>_>).fEquationDestination
  ._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5f0;
  (this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixTBBFlow<double>_>).fEquationDestination
  .fStore = (long *)0x0;
  (this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixTBBFlow<double>_>).fEquationDestination
  .fNElements = 0;
  (this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixTBBFlow<double>_>).fEquationDestination
  .fNAlloc = 0;
  TPZAutoPointer<TPZCompMesh>::~TPZAutoPointer(&local_20);
  *(undefined8 *)
   &(this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixTBBFlow<double>_>).
    super_TPZStructMatrixT<double>.super_TPZStructMatrix = 0x19dda50;
  *(undefined8 *)
   &(this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixTBBFlow<double>_>).field_0xf0 =
       0x19ddc10;
  *(undefined8 *)
   &(this->super_TPZSkylineStructMatrix<double,_TPZStructMatrixTBBFlow<double>_>).
    super_TPZStructMatrixT<double>.super_TPZStructMatrix.field_0xa0 = 0x19ddb18;
  return;
}

Assistant:

TPZSkylineNSymStructMatrix<TVar,TPar>::TPZSkylineNSymStructMatrix(TPZAutoPointer<TPZCompMesh> cmesh)
  : TPZSkylineStructMatrix<TVar,TPar>(cmesh)
{
  ///nothing here
}